

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

void compute_sorted_huffman(Codebook *c,uint8 *lengths,uint32 *values)

{
  uint uVar1;
  uint32 *puVar2;
  uint32 *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint8 uVar10;
  uint uVar11;
  long lVar12;
  int *piVar13;
  
  if (c->sparse == '\0') {
    iVar9 = c->entries;
    if (0 < iVar9) {
      lVar6 = 0;
      iVar8 = 0;
      do {
        if (0xb < (byte)(lengths[lVar6] + 1)) {
          uVar11 = c->codewords[lVar6];
          uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          uVar11 = (uVar11 & 0xf0f0f0f) << 4 | uVar11 >> 4 & 0xf0f0f0f;
          uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333) * 4;
          lVar12 = (long)iVar8;
          iVar8 = iVar8 + 1;
          c->sorted_codewords[lVar12] = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555) * 2;
          iVar9 = c->entries;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar9);
    }
  }
  else if (0 < c->sorted_entries) {
    puVar2 = c->codewords;
    puVar3 = c->sorted_codewords;
    lVar6 = 0;
    do {
      uVar11 = puVar2[lVar6];
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar11 = (uVar11 & 0xf0f0f0f) << 4 | uVar11 >> 4 & 0xf0f0f0f;
      uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333) * 4;
      puVar3[lVar6] = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555) * 2;
      lVar6 = lVar6 + 1;
    } while (lVar6 < c->sorted_entries);
  }
  SDL_qsort(c->sorted_codewords,(long)c->sorted_entries,4,uint32_compare);
  c->sorted_codewords[c->sorted_entries] = 0xffffffff;
  piVar13 = &c->sorted_entries;
  if (c->sparse == '\0') {
    piVar13 = &c->entries;
  }
  iVar9 = *piVar13;
  if (0 < (long)iVar9) {
    lVar6 = 0;
    do {
      if (c->sparse == '\0') {
        uVar10 = lengths[lVar6];
        if (0xb < (byte)(uVar10 + 1)) goto LAB_001246d2;
      }
      else {
        uVar10 = lengths[values[lVar6]];
LAB_001246d2:
        uVar11 = c->sorted_entries;
        if ((int)uVar11 < 2) {
          uVar5 = 0;
        }
        else {
          uVar5 = c->codewords[lVar6];
          uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          uVar5 = (uVar5 & 0xf0f0f0f) << 4 | uVar5 >> 4 & 0xf0f0f0f;
          uVar1 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333) * 4;
          uVar5 = 0;
          do {
            uVar7 = uVar11 >> 1;
            uVar4 = uVar7;
            if (c->sorted_codewords[uVar5 + uVar7] <=
                (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2) {
              uVar4 = uVar11 - uVar7;
              uVar5 = uVar5 + uVar7;
            }
            uVar11 = uVar4;
          } while (1 < (int)uVar11);
        }
        if (c->sparse == '\0') {
          c->sorted_values[uVar5] = (int)lVar6;
        }
        else {
          c->sorted_values[uVar5] = values[lVar6];
          c->codeword_lengths[uVar5] = uVar10;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar9);
  }
  return;
}

Assistant:

static void compute_sorted_huffman(Codebook *c, uint8 *lengths, uint32 *values)
{
   int i, len;
   // build a list of all the entries
   // OPTIMIZATION: don't include the short ones, since they'll be caught by FAST_HUFFMAN.
   // this is kind of a frivolous optimization--I don't see any performance improvement,
   // but it's like 4 extra lines of code, so.
   if (!c->sparse) {
      int k = 0;
      for (i=0; i < c->entries; ++i)
         if (include_in_sort(c, lengths[i]))
            c->sorted_codewords[k++] = bit_reverse(c->codewords[i]);
      assert(k == c->sorted_entries);
   } else {
      for (i=0; i < c->sorted_entries; ++i)
         c->sorted_codewords[i] = bit_reverse(c->codewords[i]);
   }

   qsort(c->sorted_codewords, c->sorted_entries, sizeof(c->sorted_codewords[0]), uint32_compare);
   c->sorted_codewords[c->sorted_entries] = 0xffffffff;

   len = c->sparse ? c->sorted_entries : c->entries;
   // now we need to indicate how they correspond; we could either
   //   #1: sort a different data structure that says who they correspond to
   //   #2: for each sorted entry, search the original list to find who corresponds
   //   #3: for each original entry, find the sorted entry
   // #1 requires extra storage, #2 is slow, #3 can use binary search!
   for (i=0; i < len; ++i) {
      int huff_len = c->sparse ? lengths[values[i]] : lengths[i];
      if (include_in_sort(c,huff_len)) {
         uint32 code = bit_reverse(c->codewords[i]);
         int x=0, n=c->sorted_entries;
         while (n > 1) {
            // invariant: sc[x] <= code < sc[x+n]
            int m = x + (n >> 1);
            if (c->sorted_codewords[m] <= code) {
               x = m;
               n -= (n>>1);
            } else {
               n >>= 1;
            }
         }
         assert(c->sorted_codewords[x] == code);
         if (c->sparse) {
            c->sorted_values[x] = values[i];
            c->codeword_lengths[x] = huff_len;
         } else {
            c->sorted_values[x] = i;
         }
      }
   }
}